

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O3

ThresholdState __thiscall
AbstractThresholdConditionChecker::GetStateFor
          (AbstractThresholdConditionChecker *this,CBlockIndex *pindexPrev,Params *params,
          ThresholdConditionCache *cache)

{
  _Rb_tree_header *p_Var1;
  key_type pCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CBlockIndex *this_00;
  int64_t iVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  ThresholdState TVar13;
  CBlockIndex **ppCVar14;
  int iVar15;
  int iVar16;
  long in_FS_OFFSET;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToCompute;
  CBlockIndex **local_58;
  iterator iStack_50;
  CBlockIndex **local_48;
  CBlockIndex *local_40;
  long local_38;
  long lVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = pindexPrev;
  iVar3 = (*this->_vptr_AbstractThresholdConditionChecker[4])(this,params);
  iVar4 = (*this->_vptr_AbstractThresholdConditionChecker[5])(this,params);
  iVar5 = (*this->_vptr_AbstractThresholdConditionChecker[3])(this,params);
  iVar6 = (*this->_vptr_AbstractThresholdConditionChecker[1])(this,params);
  lVar8 = CONCAT44(extraout_var,iVar6);
  iVar6 = (*this->_vptr_AbstractThresholdConditionChecker[2])(this,params);
  if (lVar8 == -1) {
    TVar13 = ACTIVE;
  }
  else {
    if (lVar8 != -2) {
      if (pindexPrev == (CBlockIndex *)0x0) {
        this_00 = (CBlockIndex *)0x0;
      }
      else {
        this_00 = CBlockIndex::GetAncestor
                            (pindexPrev,pindexPrev->nHeight - (pindexPrev->nHeight + 1) % iVar3);
        local_40 = this_00;
      }
      local_58 = (CBlockIndex **)0x0;
      iStack_50._M_current = (CBlockIndex **)0x0;
      local_48 = (CBlockIndex **)0x0;
      p_Var1 = &(cache->_M_t)._M_impl.super__Rb_tree_header;
      while( true ) {
        p_Var11 = (cache->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var12 = &p_Var1->_M_header;
        if (p_Var11 != (_Base_ptr)0x0) {
          do {
            if (*(CBlockIndex **)(p_Var11 + 1) >= this_00) {
              p_Var12 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[*(CBlockIndex **)(p_Var11 + 1) < this_00];
          } while (p_Var11 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var12 != p_Var1) && (*(CBlockIndex **)(p_Var12 + 1) <= this_00))
          goto LAB_00b25ba7;
        }
        if ((this_00 == (CBlockIndex *)0x0) ||
           (iVar9 = CBlockIndex::GetMedianTimePast(this_00), iVar9 < lVar8)) break;
        if (iStack_50._M_current == local_48) {
          std::vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>>::
          _M_realloc_insert<CBlockIndex_const*const&>
                    ((vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>> *)&local_58,
                     iStack_50,&local_40);
        }
        else {
          *iStack_50._M_current = local_40;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        this_00 = CBlockIndex::GetAncestor(local_40,local_40->nHeight - iVar3);
        local_40 = this_00;
      }
      pmVar10 = std::
                map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                ::operator[](cache,&local_40);
      *pmVar10 = DEFINED;
LAB_00b25ba7:
      p_Var11 = (cache->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &p_Var1->_M_header;
      if (p_Var11 != (_Base_ptr)0x0) {
        do {
          if (*(CBlockIndex **)(p_Var11 + 1) >= local_40) {
            p_Var12 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[*(CBlockIndex **)(p_Var11 + 1) < local_40];
        } while (p_Var11 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var12 != p_Var1) && (*(CBlockIndex **)(p_Var12 + 1) <= local_40))
        {
          pmVar10 = std::
                    map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                    ::operator[](cache,&local_40);
          TVar13 = *pmVar10;
          if (local_58 != iStack_50._M_current) {
            do {
              local_40 = iStack_50._M_current[-1];
              iStack_50._M_current = iStack_50._M_current + -1;
              if (TVar13 == DEFINED) {
                iVar9 = CBlockIndex::GetMedianTimePast(local_40);
                TVar13 = (ThresholdState)(lVar8 <= iVar9);
              }
              else if (TVar13 == LOCKED_IN) {
                TVar13 = local_40->nHeight + 1 < iVar5 ^ ACTIVE;
              }
              else if (TVar13 == STARTED) {
                iVar16 = 0;
                ppCVar14 = &local_40;
                iVar15 = iVar3;
                if (0 < iVar3) {
                  do {
                    pCVar2 = *ppCVar14;
                    uVar7 = (**this->_vptr_AbstractThresholdConditionChecker)(this,pCVar2,params);
                    iVar16 = iVar16 + (uVar7 & 0xff);
                    iVar15 = iVar15 + -1;
                    ppCVar14 = &pCVar2->pprev;
                  } while (iVar15 != 0);
                }
                TVar13 = LOCKED_IN;
                if (iVar16 < iVar4) {
                  iVar9 = CBlockIndex::GetMedianTimePast(local_40);
                  TVar13 = (uint)(CONCAT44(extraout_var_00,iVar6) <= iVar9) * 3 + STARTED;
                }
              }
              pmVar10 = std::
                        map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                        ::operator[](cache,&local_40);
              *pmVar10 = TVar13;
            } while (local_58 != iStack_50._M_current);
          }
          if (local_58 != (CBlockIndex **)0x0) {
            operator_delete(local_58,(long)local_48 - (long)local_58);
          }
          goto LAB_00b25cf7;
        }
      }
      __assert_fail("cache.count(pindexPrev)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/versionbits.cpp"
                    ,0x32,
                    "ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex *, const Consensus::Params &, ThresholdConditionCache &) const"
                   );
    }
    TVar13 = FAILED;
  }
LAB_00b25cf7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return TVar13;
}

Assistant:

ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex* pindexPrev, const Consensus::Params& params, ThresholdConditionCache& cache) const
{
    int nPeriod = Period(params);
    int nThreshold = Threshold(params);
    int min_activation_height = MinActivationHeight(params);
    int64_t nTimeStart = BeginTime(params);
    int64_t nTimeTimeout = EndTime(params);

    // Check if this deployment is always active.
    if (nTimeStart == Consensus::BIP9Deployment::ALWAYS_ACTIVE) {
        return ThresholdState::ACTIVE;
    }

    // Check if this deployment is never active.
    if (nTimeStart == Consensus::BIP9Deployment::NEVER_ACTIVE) {
        return ThresholdState::FAILED;
    }

    // A block's state is always the same as that of the first of its period, so it is computed based on a pindexPrev whose height equals a multiple of nPeriod - 1.
    if (pindexPrev != nullptr) {
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - ((pindexPrev->nHeight + 1) % nPeriod));
    }

    // Walk backwards in steps of nPeriod to find a pindexPrev whose information is known
    std::vector<const CBlockIndex*> vToCompute;
    while (cache.count(pindexPrev) == 0) {
        if (pindexPrev == nullptr) {
            // The genesis block is by definition defined.
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        if (pindexPrev->GetMedianTimePast() < nTimeStart) {
            // Optimization: don't recompute down further, as we know every earlier block will be before the start time
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        vToCompute.push_back(pindexPrev);
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);
    }

    // At this point, cache[pindexPrev] is known
    assert(cache.count(pindexPrev));
    ThresholdState state = cache[pindexPrev];

    // Now walk forward and compute the state of descendants of pindexPrev
    while (!vToCompute.empty()) {
        ThresholdState stateNext = state;
        pindexPrev = vToCompute.back();
        vToCompute.pop_back();

        switch (state) {
            case ThresholdState::DEFINED: {
                if (pindexPrev->GetMedianTimePast() >= nTimeStart) {
                    stateNext = ThresholdState::STARTED;
                }
                break;
            }
            case ThresholdState::STARTED: {
                // We need to count
                const CBlockIndex* pindexCount = pindexPrev;
                int count = 0;
                for (int i = 0; i < nPeriod; i++) {
                    if (Condition(pindexCount, params)) {
                        count++;
                    }
                    pindexCount = pindexCount->pprev;
                }
                if (count >= nThreshold) {
                    stateNext = ThresholdState::LOCKED_IN;
                } else if (pindexPrev->GetMedianTimePast() >= nTimeTimeout) {
                    stateNext = ThresholdState::FAILED;
                }
                break;
            }
            case ThresholdState::LOCKED_IN: {
                // Progresses into ACTIVE provided activation height will have been reached.
                if (pindexPrev->nHeight + 1 >= min_activation_height) {
                    stateNext = ThresholdState::ACTIVE;
                }
                break;
            }
            case ThresholdState::FAILED:
            case ThresholdState::ACTIVE: {
                // Nothing happens, these are terminal states.
                break;
            }
        }
        cache[pindexPrev] = state = stateNext;
    }

    return state;
}